

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O3

void __thiscall Trie::insert(Trie *this,char *text,size_t value)

{
  pointer *ppNVar1;
  char cVar2;
  iterator __position;
  pointer pNVar3;
  size_t sVar4;
  iterator iVar5;
  mapped_type_conflict *pmVar6;
  _Base_ptr p_Var7;
  char *pcVar8;
  LookupEntry lookupEntry;
  LookupEntry lookupEntry_1;
  Node local_60;
  size_t local_48;
  key_type local_40;
  
  local_60.hasValue = (bool)*text;
  local_48 = value;
  if (local_60.hasValue == false) {
    local_60.index = 0;
  }
  else {
    pcVar8 = text + 1;
    p_Var7 = (_Base_ptr)0x0;
    do {
      local_60.index = (size_t)p_Var7;
      iVar5 = std::
              _Rb_tree<Trie::LookupEntry,_std::pair<const_Trie::LookupEntry,_unsigned_long>,_std::_Select1st<std::pair<const_Trie::LookupEntry,_unsigned_long>_>,_std::less<Trie::LookupEntry>,_std::allocator<std::pair<const_Trie::LookupEntry,_unsigned_long>_>_>
              ::find(&(this->lookup)._M_t,(key_type *)&local_60);
      if ((_Rb_tree_header *)iVar5._M_node == &(this->lookup)._M_t._M_impl.super__Rb_tree_header) {
        local_60.index = (size_t)p_Var7;
        if (pcVar8[-1] != '\0') {
          do {
            __position._M_current =
                 (this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_60.index =
                 ((long)__position._M_current -
                  (long)(this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            local_60.hasValue = false;
            local_60.value = 0;
            if (__position._M_current ==
                (this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Trie::Node,std::allocator<Trie::Node>>::
              _M_realloc_insert<Trie::Node_const&>
                        ((vector<Trie::Node,std::allocator<Trie::Node>> *)this,__position,&local_60)
              ;
            }
            else {
              (__position._M_current)->value = 0;
              (__position._M_current)->index = local_60.index;
              *(ulong *)&(__position._M_current)->hasValue = (ulong)(uint7)local_60._9_7_ << 8;
              ppNVar1 = &(this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppNVar1 = *ppNVar1 + 1;
            }
            sVar4 = local_60.index;
            local_40.input = pcVar8[-1];
            local_40.node = (size_t)p_Var7;
            pmVar6 = std::
                     map<Trie::LookupEntry,_unsigned_long,_std::less<Trie::LookupEntry>,_std::allocator<std::pair<const_Trie::LookupEntry,_unsigned_long>_>_>
                     ::operator[](&this->lookup,&local_40);
            *pmVar6 = sVar4;
            cVar2 = *pcVar8;
            pcVar8 = pcVar8 + 1;
            p_Var7 = (_Base_ptr)local_60.index;
          } while (cVar2 != '\0');
        }
        break;
      }
      local_60.index = (size_t)iVar5._M_node[1]._M_left;
      local_60.hasValue = (bool)*pcVar8;
      pcVar8 = pcVar8 + 1;
      p_Var7 = (_Base_ptr)local_60.index;
    } while (local_60.hasValue != false);
  }
  pNVar3 = (this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar3[local_60.index].hasValue = true;
  pNVar3[local_60.index].value = local_48;
  return;
}

Assistant:

void Trie::insert(const char* text, size_t value)
{
	size_t node = 0;	// root node

	// traverse existing nodes
	while (*text != 0)
	{
		LookupEntry lookupEntry { node, *text };
		auto it = lookup.find(lookupEntry);
		if (it == lookup.end())
			break;

		node = it->second;
		text++;
	}

	// add new nodes as necessary
	while (*text != 0)
	{
		Node newNode { nodes.size(), false, 0 };
		nodes.push_back(newNode);

		LookupEntry lookupEntry { node, *text };
		lookup[lookupEntry] = newNode.index;
		node = newNode.index;
		text++;
	}

	// set value
	nodes[node].hasValue = true;
	nodes[node].value = value;
}